

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32.c
# Opt level: O0

void elf32_makestabs(GlobalVars *gv)

{
  char cVar1;
  uint32_t uVar2;
  node *pnVar3;
  Reloc *r_00;
  LinkedSection *pLVar4;
  long in_RDI;
  bool bVar5;
  Reloc *r;
  uint32_t fun_addr;
  bool within_fun;
  nlist32 *nlst;
  unsigned_long stabsize;
  StabDebug *stab;
  ObjectUnit *obj;
  LinkedSection *ls;
  bool so_found;
  StabCompUnit *cu;
  bool be;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  node *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar6;
  uint8_t in_stack_ffffffffffffffb4;
  undefined1 uVar7;
  uint8_t in_stack_ffffffffffffffb5;
  undefined1 uVar8;
  uint8_t in_stack_ffffffffffffffb6;
  undefined1 uVar9;
  uint8_t in_stack_ffffffffffffffb7;
  undefined1 uVar10;
  StrTabList *in_stack_ffffffffffffffb8;
  GlobalVars *gv_00;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 uVar11;
  long *name;
  GlobalVars *in_stack_ffffffffffffffd8;
  StabCompUnit *local_18;
  
  stabdebugidx = 0;
  initlist(&stabcompunits);
  if (*(char *)(in_RDI + 0x78) == '\0') {
    local_18 = (StabCompUnit *)0x0;
    bVar5 = false;
    gv_00 = (GlobalVars *)0x0;
    for (name = *(long **)(in_RDI + 0x150);
        uVar11 = (undefined4)((ulong)in_stack_ffffffffffffffc8 >> 0x20), *name != 0;
        name = (long *)*name) {
      while (pnVar3 = remhead((list *)(name + 10)), pnVar3 != (node *)0x0) {
        if ((*(char *)&pnVar3[2].next == 'd') && (pnVar3[1].pred != (node *)0x0)) {
          if ((*(char *)&(pnVar3[1].pred)->next != '\0') && (!bVar5)) {
            gv_00 = (GlobalVars *)((long)&(gv_00->libpaths).dummy + 4);
            local_18 = newCompUnit();
            addtail(&stabcompunits,&local_18->n);
            bVar5 = true;
          }
        }
        else {
          bVar5 = false;
        }
        if (local_18 == (StabCompUnit *)0x0) {
          ierror("%s: N_SO missing",elf32_makestabs::fn);
        }
        if (0x7ffe < local_18->entries) {
          ierror("%s: too many stab-entries for compilation unit",elf32_makestabs::fn);
        }
        gv_00 = (GlobalVars *)((long)&(gv_00->libpaths).dummy + 4);
        local_18->entries = local_18->entries + 1;
        if (pnVar3[1].pred == (node *)0x0) {
          pnVar3[1].pred = (node *)0x0;
        }
        else {
          uVar2 = elf_addstrlist(in_stack_ffffffffffffffb8,
                                 (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                  CONCAT16(in_stack_ffffffffffffffb6,
                                                           CONCAT15(in_stack_ffffffffffffffb5,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffffb4,
                                                  in_stack_ffffffffffffffb0)))));
          pnVar3[1].pred = (node *)(ulong)uVar2;
        }
        if (bVar5) {
          local_18->nameidx = (long)pnVar3[1].pred;
        }
        addtail(&local_18->stabs,pnVar3);
      }
      in_stack_ffffffffffffffc8 = 0;
    }
    if (gv_00 != (GlobalVars *)0x0) {
      r_00 = (Reloc *)alloc(CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      pLVar4 = find_lnksec(in_stack_ffffffffffffffd8,(char *)name,(uint8_t)((uint)uVar11 >> 0x18),
                           (uint8_t)((uint)uVar11 >> 0x10),(uint8_t)((uint)uVar11 >> 8),
                           (uint8_t)uVar11);
      if (pLVar4 == (LinkedSection *)0x0) {
        pLVar4 = create_lnksect(gv_00,(char *)r_00,in_stack_ffffffffffffffb7,
                                in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb5,
                                in_stack_ffffffffffffffb4,(uint32_t)name);
      }
      else if (pLVar4->size != 0) {
        ierror("%s: .stab already in use",elf32_makestabs::fn);
      }
      pLVar4->filesize = (unsigned_long)gv_00;
      pLVar4->size = (unsigned_long)gv_00;
      pLVar4->data = (uint8_t *)r_00;
      stabdebugidx = elf_addshdrstr((char *)0x12bae7);
      for (local_18 = (StabCompUnit *)stabcompunits.first; (local_18->n).next != (node *)0x0;
          local_18 = *(StabCompUnit **)&local_18->n) {
        uVar7 = 0;
        uVar8 = 0;
        uVar9 = 0;
        uVar10 = 0;
        iVar6 = 0;
        r_00 = (Reloc *)((long)&(r_00->n).pred + 4);
        write_nlist((bool)((ulong)gv_00 >> 0x20),(nlist32 *)r_00,0,
                    (uint8_t)((ulong)in_stack_ffffffffffffffa8 >> 0x38),
                    (int8_t)((ulong)in_stack_ffffffffffffffa8 >> 0x30),
                    (int16_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(uint32_t)name);
        for (pnVar3 = ((node *)((long)local_18 + 0x20))->next; pnVar3->next != (node *)0x0;
            pnVar3 = pnVar3->next) {
          cVar1 = *(char *)&pnVar3[2].next;
          if (cVar1 == '$') {
            bVar5 = pnVar3[1].pred == (node *)0x0;
            if (bVar5) {
              *(int *)((long)&pnVar3[2].next + 4) = *(int *)((long)&pnVar3[2].next + 4) - iVar6;
              pnVar3[1].next = (node *)0x0;
            }
            else {
              iVar6 = *(int *)((long)&pnVar3[2].next + 4);
            }
            uVar10 = 0;
            uVar9 = 0;
            uVar8 = 0;
            uVar7 = !bVar5;
          }
          else if (cVar1 == 'D') {
            if ((CONCAT13(uVar10,CONCAT12(uVar9,CONCAT11(uVar8,uVar7))) != 0) &&
               (pnVar3[1].next != (node *)0x0)) {
              *(int *)((long)&pnVar3[2].next + 4) = *(int *)((long)&pnVar3[2].next + 4) - iVar6;
              pnVar3[1].next = (node *)0x0;
            }
          }
          else if (cVar1 == 'd') {
            uVar7 = 0;
            uVar8 = 0;
            uVar9 = 0;
            uVar10 = 0;
          }
          if (pnVar3[1].next != (node *)0x0) {
            in_stack_ffffffffffffffa8 =
                 (node *)alloczero((ulong)CONCAT14(cVar1,in_stack_ffffffffffffffa0));
            *(int *)((long)&pnVar3[2].next + 4) =
                 *(int *)((long)&pnVar3[2].next + 4) + (int)pnVar3[1].next[4].next;
            in_stack_ffffffffffffffa8[1].pred = pnVar3[1].next[1].pred;
            in_stack_ffffffffffffffa8[2].next = (node *)((long)r_00 + (8 - (long)pLVar4->data));
            in_stack_ffffffffffffffa8[2].pred = (node *)(ulong)*(uint *)((long)&pnVar3[2].next + 4);
            *(undefined1 *)&in_stack_ffffffffffffffa8[3].pred = 1;
            addreloc((Section *)gv_00,r_00,CONCAT11(uVar10,uVar9),CONCAT11(uVar8,uVar7),
                     (lword)in_stack_ffffffffffffffa8);
            addtail(&pLVar4->relocs,in_stack_ffffffffffffffa8);
          }
          r_00 = (Reloc *)((long)&(r_00->n).pred + 4);
          write_nlist((bool)((ulong)gv_00 >> 0x20),(nlist32 *)r_00,
                      CONCAT17(uVar10,CONCAT16(uVar9,CONCAT15(uVar8,CONCAT14(uVar7,iVar6)))),
                      (uint8_t)((ulong)in_stack_ffffffffffffffa8 >> 0x38),
                      (int8_t)((ulong)in_stack_ffffffffffffffa8 >> 0x30),
                      (int16_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(uint32_t)name);
        }
      }
    }
  }
  return;
}

Assistant:

static void elf32_makestabs(struct GlobalVars *gv)
/* create .stab, .stabstr und .rela.stab sections from StabDebug records */
{
  static const char *fn = "elf32_makestabs";
  bool be = elf_endianess == _BIG_ENDIAN_;

  stabdebugidx = 0;
  initlist(&stabcompunits);

  if (gv->strip_symbols < STRIP_DEBUG) {
    struct StabCompUnit *cu = NULL;
    bool so_found = FALSE;
    struct LinkedSection *ls;
    struct ObjectUnit *obj;
    struct StabDebug *stab;
    unsigned long stabsize = 0;

    /* determine size of .stab section to generate */
    for (obj=(struct ObjectUnit *)gv->selobjects.first,stabsize=0;
         obj->n.next!=NULL; obj=(struct ObjectUnit *)obj->n.next) {

      while (stab=(struct StabDebug *)remhead(&obj->stabs)) {

        if (stab->n_type==N_SO && stab->name.ptr!=NULL) {
          if (*stab->name.ptr != '\0') {
            if (!so_found) {
              /* allocate and initialize new compilation unit */
              stabsize += sizeof(struct nlist32);  /* comp.unit header */
              cu = newCompUnit();
              addtail(&stabcompunits,&cu->n);
              so_found = TRUE;
            }
          }
        }
        else
          so_found = FALSE;

        if (cu == NULL)
          ierror("%s: N_SO missing",fn);
        if (cu->entries >= 0x7fff)
          ierror("%s: too many stab-entries for compilation unit",fn);
        stabsize += sizeof(struct nlist32);  /* stab entry */
        cu->entries++;

        /* register symbol name in comp.unit's string table */
        if (stab->name.ptr)
          stab->name.idx = elf_addstrlist(&cu->strtab,stab->name.ptr);
        else
          stab->name.idx = 0;

        if (so_found)
          cu->nameidx = stab->name.idx;  /* set comp.unit name */

        /* append stab entry to current comp.unit */
        addtail(&cu->stabs,&stab->n);
      }
    }

    if (stabsize) {
      /* create .stab section with contents for real */
      struct nlist32 *nlst = alloc(stabsize);

      if (ls = find_lnksec(gv,".stab",0,0,0,0)) {
        if (ls->size > 0)
          ierror("%s: .stab already in use",fn);
      }
      else
        ls = create_lnksect(gv,".stab",ST_DATA,0,SP_READ,2,0);
      ls->size = ls->filesize = stabsize;
      ls->data = (uint8_t *)nlst;

      /* allocate SHDR name for .stabstr */
      stabdebugidx = elf_addshdrstr(".stabstr");

      /* transfer nodes from compilation units to section's data area */
      for (cu=(struct StabCompUnit *)stabcompunits.first;
           cu->n.next!=NULL; cu=(struct StabCompUnit *)cu->n.next) {
        bool within_fun = FALSE;
        uint32_t fun_addr = 0;

        /* write compilation unit stab header containing number
           of stabs and length of string-table */
        write_nlist(be,nlst++,cu->nameidx,0,0,cu->entries,
                    cu->strtab.nextindex);

        /* write comp.unit's stabs */
        for (stab=(struct StabDebug *)cu->stabs.first;
             stab->n.next!=NULL; stab=(struct StabDebug *)stab->n.next) {

          switch (stab->n_type) {
            case N_SO:
              within_fun = FALSE;
              break;
            case N_FUN:
              if (stab->name.idx) {
                within_fun = TRUE;
                fun_addr = stab->n_value;
              }
              else {  /* function end address needs to be relative (size) */
                within_fun = FALSE;
                stab->n_value -= fun_addr;
                stab->relsect = NULL;
              }
              break;
            case N_SLINE:
              if (within_fun && stab->relsect) {
                /* convert address into a function-offset */
                stab->n_value -= fun_addr;
                stab->relsect = NULL;
              }
              break;
          }

          /* add relocation, if required */
          if (stab->relsect) {
            struct Reloc *r = alloczero(sizeof(struct Reloc));

            stab->n_value += stab->relsect->offset;
            r->relocsect.lnk = stab->relsect->lnksec;
            r->offset = (uint8_t *)&nlst->n_value - ls->data;
            r->addend = (lword)stab->n_value;
            r->rtype = R_ABS;
            addreloc(NULL,r,0,32,-1);
            addtail(&ls->relocs,&r->n);
          }

          /* write stab entry to section */
          write_nlist(be,nlst++,stab->name.idx,stab->n_type,
                      stab->n_othr,stab->n_desc,stab->n_value);
        }
      }
    }
  }
}